

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_medcon_external(CImg<unsigned_char> *this,char *filename)

{
  char *pcVar1;
  FILE *pFVar2;
  char *pcVar3;
  CImg<char> *pCVar4;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  ulong uVar5;
  char *pcVar6;
  CImg<char> command;
  CImg<char> filename_tmp;
  CImg<char> body;
  CImg<char> local_70;
  CImg<char> local_50;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar6 = "non-";
    if (this->_is_shared != false) {
      pcVar6 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_medcon_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar6,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  pFVar2 = cimg::fopen(filename,"rb");
  fclose(pFVar2);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::CImg(&body,0x100,1,1,1);
  pFVar2 = cimg::fopen(filename,"r");
  cimg::fclose(pFVar2);
  while( true ) {
    pcVar6 = filename_tmp._data;
    uVar5 = (ulong)filename_tmp._width;
    cimg::filenamerand();
    snprintf(pcVar6,uVar5,"%s.hdr");
    pFVar2 = fopen(filename_tmp._data,"rb");
    pcVar6 = command._data;
    if (pFVar2 == (FILE *)0x0) break;
    cimg::fclose(pFVar2);
  }
  uVar5 = (ulong)command._width;
  pcVar3 = cimg::medcon_path((char *)0x0,false);
  CImg<char>::string(&local_50,filename_tmp._data,true,false);
  pCVar4 = CImg<char>::_system_strescape(&local_50);
  pcVar1 = pCVar4->_data;
  CImg<char>::string(&local_70,filename,true,false);
  pCVar4 = CImg<char>::_system_strescape(&local_70);
  snprintf(pcVar6,uVar5,"%s -w -c anlz -o \"%s\" -f \"%s\"",pcVar3,pcVar1,pCVar4->_data);
  CImg<char>::~CImg(&local_70);
  CImg<char>::~CImg(&local_50);
  cimg::system(command._data);
  cimg::split_filename(filename_tmp._data,body._data);
  snprintf(command._data,(ulong)command._width,"%s.hdr",body._data);
  pFVar2 = fopen(command._data,"rb");
  if (pFVar2 == (FILE *)0x0) {
    snprintf(command._data,(ulong)command._width,"m000-%s.hdr",body._data);
    pFVar2 = fopen(command._data,"rb");
    if (pFVar2 == (FILE *)0x0) {
      this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar6 = "non-";
      if (this->_is_shared != false) {
        pcVar6 = "";
      }
      CImgIOException::CImgIOException
                (this_01,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_medcon_external(): Failed to load file \'%s\' with external command \'medcon\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar6,"unsigned char",filename);
      __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
  }
  cimg::fclose(pFVar2);
  load_analyze(this,command._data,(float *)0x0);
  remove(command._data);
  cimg::split_filename(command._data,body._data);
  snprintf(command._data,(ulong)command._width,"%s.img",body._data);
  remove(command._data);
  CImg<char>::~CImg(&body);
  CImg<char>::~CImg(&filename_tmp);
  CImg<char>::~CImg(&command);
  return this;
}

Assistant:

CImg<T>& load_medcon_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_medcon_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      cimg::fclose(cimg::fopen(filename,"r"));
      std::FILE *file = 0;
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s.hdr",cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -w -c anlz -o \"%s\" -f \"%s\"",
                    cimg::medcon_path(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data(),
                    CImg<charT>::string(filename)._system_strescape().data());
      cimg::system(command);
      cimg::split_filename(filename_tmp,body);

      cimg_snprintf(command,command._width,"%s.hdr",body._data);
      file = std::fopen(command,"rb");
      if (!file) {
        cimg_snprintf(command,command._width,"m000-%s.hdr",body._data);
        file = std::fopen(command,"rb");
        if (!file) {
          throw CImgIOException(_cimg_instance
                                "load_medcon_external(): Failed to load file '%s' with external command 'medcon'.",
                                cimg_instance,
                                filename);
        }
      }
      cimg::fclose(file);
      load_analyze(command);
      std::remove(command);
      cimg::split_filename(command,body);
      cimg_snprintf(command,command._width,"%s.img",body._data);
      std::remove(command);
      return *this;
    }